

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Mix_1in_2out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float baseVolume,float *src,
               float *dst,float *channelVolume,float *coefficients)

{
  float fVar1;
  undefined8 uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (toMix != 0) {
    fVar1 = *channelVolume;
    uVar2 = *(undefined8 *)coefficients;
    lVar3 = 0;
    do {
      fVar4 = src[lVar3] * baseVolume * fVar1;
      fVar5 = fVar4 * (float)uVar2 + (float)*(undefined8 *)(dst + lVar3 * 2);
      fVar6 = fVar4 * (float)((ulong)uVar2 >> 0x20) +
              (float)((ulong)*(undefined8 *)(dst + lVar3 * 2) >> 0x20);
      *(ulong *)(dst + lVar3 * 2) = CONCAT44(fVar6,fVar5);
      fVar4 = 16777216.0;
      if ((fVar5 <= 16777216.0) && (fVar4 = -16777216.0, -16777216.0 <= fVar5)) {
        fVar4 = fVar5;
      }
      dst[lVar3 * 2] = fVar4;
      fVar4 = 16777216.0;
      if ((fVar6 <= 16777216.0) && (fVar4 = -16777216.0, -16777216.0 <= fVar6)) {
        fVar4 = fVar6;
      }
      dst[lVar3 * 2 + 1] = fVar4;
      lVar3 = lVar3 + 1;
    } while (toMix != (uint32_t)lVar3);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_2out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float baseVolume,
	float *restrict src,
	float *restrict dst,
	float *restrict channelVolume,
	float *restrict coefficients
) {
	uint32_t i;
	float totalVolume = baseVolume * channelVolume[0];
	for (i = 0; i < toMix; i += 1, src += 1, dst += 2)
	{
		/* Base source data... */
		const float sample = src[0] * totalVolume;

		/* ... combined with the coefficients... */
		dst[0] += sample * coefficients[0];
		dst[1] += sample * coefficients[1];

		/* ... then clamped. */
		dst[0] = FAudio_clamp(
			dst[0],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
		dst[1] = FAudio_clamp(
			dst[1],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
	}
}